

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txoutproof.cpp
# Opt level: O0

RPCHelpMan * gettxoutproof(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff6a8;
  allocator<RPCArg> *this;
  RPCArg *this_00;
  anon_class_1_0_00000001 *in_stack_fffffffffffff6b0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6c0;
  allocator_type *in_stack_fffffffffffff6e0;
  allocator<char> *in_stack_fffffffffffff6e8;
  iterator in_stack_fffffffffffff6f0;
  RPCArgOptions *in_stack_fffffffffffff6f8;
  string *in_stack_fffffffffffff700;
  Fallback *in_stack_fffffffffffff708;
  undefined1 skip_type_check;
  string *in_stack_fffffffffffff710;
  undefined1 *puVar2;
  string *in_stack_fffffffffffff718;
  RPCArg *in_stack_fffffffffffff720;
  RPCExamples *pRVar3;
  string *in_stack_fffffffffffff728;
  RPCExamples *pRVar4;
  RPCArg *in_stack_fffffffffffff730;
  RPCArgOptions *in_stack_fffffffffffff750;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffff800;
  string *in_stack_fffffffffffff808;
  RPCHelpMan *name;
  RPCHelpMan *in_stack_fffffffffffff818;
  allocator<char> local_7b9;
  pointer local_7b8;
  pointer pRStack_7b0;
  pointer local_7a8;
  allocator<char> local_79a;
  allocator<char> local_799 [32];
  allocator<char> local_779 [6];
  allocator<char> local_773 [2];
  allocator<char> local_771 [8];
  allocator<char> local_769 [32];
  allocator<char> local_749;
  undefined4 local_748;
  allocator<char> local_741 [31];
  allocator<char> local_722;
  allocator<char> local_721 [49];
  pointer in_stack_fffffffffffff910;
  allocator<RPCArg> local_530 [40];
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined1 local_4f0;
  undefined1 local_4ef;
  undefined1 local_4e8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined1 local_4a8;
  undefined1 local_4a7;
  undefined1 local_400 [264];
  undefined1 local_2f8 [160];
  RPCExamples local_258 [16];
  RPCExamples local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  name = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  local_748._0_1_ = '\0';
  local_748._1_3_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff6b8,(Optional *)in_stack_fffffffffffff6b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  local_771[1] = (allocator<char>)0x1;
  local_771[2] = (allocator<char>)0x0;
  local_771[3] = (allocator<char>)0x0;
  local_771[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff6b8,(Optional *)in_stack_fffffffffffff6b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  local_4e8 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff6c0);
  local_4c0 = 0;
  uStack_4b8 = 0;
  local_4b0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff6a8);
  local_4a8 = 0;
  local_4a7 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                 (Type)((ulong)in_stack_fffffffffffff710 >> 0x20),in_stack_fffffffffffff708,
                 in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff6a8);
  __l._M_len = (size_type)in_stack_fffffffffffff6f8;
  __l._M_array = in_stack_fffffffffffff6f0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff6e8,__l,
             in_stack_fffffffffffff6e0);
  local_530[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_fffffffffffff6c0);
  local_508 = 0;
  uStack_500 = 0;
  local_4f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff6a8);
  local_4f0 = 0;
  local_4ef = 0;
  this = local_530;
  RPCArg::RPCArg(in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                 (Type)((ulong)in_stack_fffffffffffff720 >> 0x20),
                 (Fallback *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff708,
                 in_stack_fffffffffffff750);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  local_779[1] = (allocator<char>)0x1;
  local_779[2] = (allocator<char>)0x0;
  local_779[3] = (allocator<char>)0x0;
  local_779[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff6b8,(Optional *)in_stack_fffffffffffff6b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::__cxx11::string::string(in_stack_fffffffffffff6c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  RPCArg::RPCArg(in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                 (Type)((ulong)in_stack_fffffffffffff710 >> 0x20),in_stack_fffffffffffff708,
                 in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff708 >> 0x38);
  pRVar4 = local_258;
  results = (RPCResults *)0x2;
  std::allocator<RPCArg>::allocator(this);
  __l_00._M_len = (size_type)in_stack_fffffffffffff6f8;
  __l_00._M_array = in_stack_fffffffffffff6f0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff6e8,__l_00,
             in_stack_fffffffffffff6e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  local_7b8 = (pointer)0x0;
  pRStack_7b0 = (pointer)0x0;
  local_7a8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_fffffffffffff730,(Type)((ulong)in_stack_fffffffffffff728 >> 0x20)
             ,&in_stack_fffffffffffff720->m_names,in_stack_fffffffffffff718,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff710,
             (bool)skip_type_check);
  RPCResults::RPCResults
            ((RPCResults *)in_stack_fffffffffffff728,(RPCResult *)in_stack_fffffffffffff720);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x7370dc);
  this_00 = (RPCArg *)&stack0xfffffffffffff820;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<gettxoutproof()::__0,void>(in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
  RPCHelpMan::RPCHelpMan
            (in_stack_fffffffffffff818,&name->m_name,in_stack_fffffffffffff808,
             in_stack_fffffffffffff800,results,pRVar4,(RPCMethodImpl *)in_stack_fffffffffffff910);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_7b9);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6b8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_79a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_799);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff6b8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  pRVar4 = local_258;
  pRVar3 = local_48;
  do {
    pRVar3 = (RPCExamples *)((long)&pRVar3[-9].m_examples.field_2 + 8);
    RPCArg::~RPCArg(this_00);
  } while (pRVar3 != pRVar4);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_779);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_773);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff6b8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar2 = local_400;
  puVar1 = local_2f8;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_771);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_769);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_749);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_741);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_722);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_721);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan gettxoutproof()
{
    return RPCHelpMan{"gettxoutproof",
        "\nReturns a hex-encoded proof that \"txid\" was included in a block.\n"
        "\nNOTE: By default this function only works sometimes. This is when there is an\n"
        "unspent output in the utxo for this transaction. To make it always work,\n"
        "you need to maintain a transaction index, using the -txindex command line option or\n"
        "specify the block in which the transaction is included manually (by blockhash).\n",
        {
            {"txids", RPCArg::Type::ARR, RPCArg::Optional::NO, "The txids to filter",
                {
                    {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "A transaction hash"},
                },
            },
            {"blockhash", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "If specified, looks for txid in the block with this hash"},
        },
        RPCResult{
            RPCResult::Type::STR, "data", "A string that is a serialized, hex-encoded data for the proof."
        },
        RPCExamples{""},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            std::set<Txid> setTxids;
            UniValue txids = request.params[0].get_array();
            if (txids.empty()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Parameter 'txids' cannot be empty");
            }
            for (unsigned int idx = 0; idx < txids.size(); idx++) {
                auto ret{setTxids.insert(Txid::FromUint256(ParseHashV(txids[idx], "txid")))};
                if (!ret.second) {
                    throw JSONRPCError(RPC_INVALID_PARAMETER, std::string("Invalid parameter, duplicated txid: ") + txids[idx].get_str());
                }
            }

            const CBlockIndex* pblockindex = nullptr;
            uint256 hashBlock;
            ChainstateManager& chainman = EnsureAnyChainman(request.context);
            if (!request.params[1].isNull()) {
                LOCK(cs_main);
                hashBlock = ParseHashV(request.params[1], "blockhash");
                pblockindex = chainman.m_blockman.LookupBlockIndex(hashBlock);
                if (!pblockindex) {
                    throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
                }
            } else {
                LOCK(cs_main);
                Chainstate& active_chainstate = chainman.ActiveChainstate();

                // Loop through txids and try to find which block they're in. Exit loop once a block is found.
                for (const auto& tx : setTxids) {
                    const Coin& coin{AccessByTxid(active_chainstate.CoinsTip(), tx)};
                    if (!coin.IsSpent()) {
                        pblockindex = active_chainstate.m_chain[coin.nHeight];
                        break;
                    }
                }
            }


            // Allow txindex to catch up if we need to query it and before we acquire cs_main.
            if (g_txindex && !pblockindex) {
                g_txindex->BlockUntilSyncedToCurrentChain();
            }

            if (pblockindex == nullptr) {
                const CTransactionRef tx = GetTransaction(/*block_index=*/nullptr, /*mempool=*/nullptr, *setTxids.begin(), hashBlock, chainman.m_blockman);
                if (!tx || hashBlock.IsNull()) {
                    throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Transaction not yet in block");
                }

                LOCK(cs_main);
                pblockindex = chainman.m_blockman.LookupBlockIndex(hashBlock);
                if (!pblockindex) {
                    throw JSONRPCError(RPC_INTERNAL_ERROR, "Transaction index corrupt");
                }
            }

            {
                LOCK(cs_main);
                CheckBlockDataAvailability(chainman.m_blockman, *pblockindex, /*check_for_undo=*/false);
            }
            CBlock block;
            if (!chainman.m_blockman.ReadBlockFromDisk(block, *pblockindex)) {
                throw JSONRPCError(RPC_INTERNAL_ERROR, "Can't read block from disk");
            }

            unsigned int ntxFound = 0;
            for (const auto& tx : block.vtx) {
                if (setTxids.count(tx->GetHash())) {
                    ntxFound++;
                }
            }
            if (ntxFound != setTxids.size()) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Not all transactions found in specified or retrieved block");
            }

            DataStream ssMB{};
            CMerkleBlock mb(block, setTxids);
            ssMB << mb;
            std::string strHex = HexStr(ssMB);
            return strHex;
        },
    };
}